

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O2

int __thiscall ncnn::LSTM_x86_avx512::create_pipeline_int8(LSTM_x86_avx512 *this,Option *opt)

{
  Mat *weight_xc;
  Mat *weight_xc_int8_scales;
  Mat *weight_hc;
  Mat *weight_hc_int8_scales;
  Mat *bias_c;
  int _w;
  int num_output;
  int *piVar1;
  Allocator *pAVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 *puVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 *puVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  undefined1 *puVar31;
  undefined1 *puVar32;
  long lVar33;
  long lVar34;
  undefined1 *puVar35;
  undefined1 *puVar36;
  long lVar37;
  undefined1 *puVar38;
  undefined1 *puVar39;
  long lVar40;
  long lVar41;
  undefined8 *puVar42;
  undefined1 *puVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  undefined1 *puVar54;
  undefined1 *puVar55;
  long lVar56;
  long lVar57;
  undefined1 *puVar58;
  undefined1 *puVar59;
  undefined8 *puVar60;
  ulong uVar61;
  undefined1 *puVar62;
  uint _c;
  long lVar63;
  undefined1 *puVar64;
  ulong uVar65;
  long lVar66;
  undefined1 *puVar67;
  undefined1 *puVar68;
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  int size;
  undefined1 *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_278;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_170;
  long local_150;
  long local_148;
  undefined1 *local_e8;
  
  _c = ((this->super_LSTM).direction == 2) + 1;
  uVar65 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
  _w = (this->super_LSTM).hidden_size;
  lVar22 = (long)_w;
  uVar65 = (long)((ulong)(uint)((int)uVar65 >> 0x1f) << 0x20 | uVar65 & 0xffffffff) / (long)_w;
  weight_xc = &(this->super_LSTM).weight_xc_data;
  weight_xc_int8_scales = &(this->super_LSTM).weight_xc_data_int8_scales;
  weight_hc = &(this->super_LSTM).weight_hc_data;
  weight_hc_int8_scales = &(this->super_LSTM).weight_hc_data_int8_scales;
  bias_c = &(this->super_LSTM).bias_c_data;
  num_output = (this->super_LSTM).num_output;
  lVar13 = (long)num_output;
  iVar12 = cpu_support_x86_avx512_vnni();
  size = (int)((long)((ulong)(uint)((int)uVar65 >> 0x1f) << 0x20 | uVar65 & 0xffffffff) / 4);
  if (iVar12 == 0) {
    iVar12 = (_w / 4) * -3 + _w;
    Mat::create(&this->weight_data_tm,num_output + size,iVar12,_c,0x10,0x10,(Allocator *)0x0);
    Mat::create(&this->weight_data_tm_int8_descales,0x20,iVar12,_c,4,(Allocator *)0x0);
    Mat::create(&this->bias_c_data_packed,_w,1,_c,0x10,4,(Allocator *)0x0);
    lVar27 = (long)(_w * 2);
    lVar23 = (long)(_w * 3);
    lVar14 = (long)size;
    uVar65 = 0;
    auVar69 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    for (; uVar65 != _c; uVar65 = uVar65 + 1) {
      lVar33 = (long)(this->super_LSTM).weight_xc_data.w;
      sVar3 = (this->super_LSTM).weight_xc_data.elemsize;
      sVar4 = (this->super_LSTM).bias_c_data.elemsize;
      lVar24 = (this->super_LSTM).bias_c_data.cstep * uVar65 * sVar4;
      sVar5 = (this->weight_data_tm_int8_descales).elemsize;
      lVar56 = (this->weight_data_tm_int8_descales).cstep * uVar65 * sVar5;
      lVar44 = (long)(this->super_LSTM).bias_c_data.w * sVar4;
      lVar15 = sVar3 * lVar33;
      lVar28 = (long)(this->weight_data_tm_int8_descales).w * sVar5;
      lVar29 = (this->super_LSTM).weight_xc_data.cstep * uVar65;
      lVar45 = ((lVar23 + 1) * lVar33 + lVar29) * sVar3;
      lVar46 = ((lVar27 + 1) * lVar33 + lVar29) * sVar3;
      lVar47 = ((lVar22 + 1) * lVar33 + lVar29) * sVar3;
      lVar48 = (lVar29 + lVar33) * sVar3;
      lVar49 = (lVar23 * lVar33 + lVar29) * sVar3;
      lVar50 = (lVar27 * lVar33 + lVar29) * sVar3;
      lVar34 = (lVar33 * lVar22 + lVar29) * sVar3;
      lVar30 = lVar29 * sVar3;
      lVar40 = (long)(this->super_LSTM).weight_hc_data.w;
      sVar4 = (this->super_LSTM).weight_hc_data.elemsize;
      lVar51 = sVar4 * lVar40;
      lVar52 = (this->super_LSTM).weight_hc_data.cstep * uVar65;
      lVar63 = ((lVar23 + 1) * lVar40 + lVar52) * sVar4;
      lVar66 = ((lVar27 + 1) * lVar40 + lVar52) * sVar4;
      lVar37 = ((lVar22 + 1) * lVar40 + lVar52) * sVar4;
      lVar16 = (lVar52 + lVar40) * sVar4;
      lVar25 = (lVar23 * lVar40 + lVar52) * sVar4;
      lVar57 = (lVar27 * lVar40 + lVar52) * sVar4;
      lVar41 = (lVar40 * lVar22 + lVar52) * sVar4;
      lVar53 = lVar52 * sVar4;
      pvVar6 = (this->super_LSTM).weight_xc_data.data;
      puVar64 = (undefined1 *)(((lVar23 + 3) * lVar33 + lVar29) * sVar3 + (long)pvVar6);
      local_400 = (undefined1 *)(((lVar27 + 3) * lVar33 + lVar29) * sVar3 + (long)pvVar6);
      local_408 = (undefined1 *)(((lVar22 + 3) * lVar33 + lVar29) * sVar3 + (long)pvVar6);
      local_3b0 = (undefined1 *)((lVar33 * 3 + lVar29) * sVar3 + (long)pvVar6);
      local_350 = (undefined1 *)(((lVar23 + 2) * lVar33 + lVar29) * sVar3 + (long)pvVar6);
      local_358 = (undefined1 *)(((lVar27 + 2) * lVar33 + lVar29) * sVar3 + (long)pvVar6);
      local_360 = (undefined1 *)(((lVar22 + 2) * lVar33 + lVar29) * sVar3 + (long)pvVar6);
      local_368 = (undefined1 *)((lVar29 + lVar33 * 2) * sVar3 + (long)pvVar6);
      puVar35 = (undefined1 *)((long)pvVar6 + lVar45);
      local_1c0 = (undefined1 *)((long)pvVar6 + lVar45 + 3);
      local_1c8 = (undefined1 *)((long)pvVar6 + lVar45 + 1);
      local_310 = (undefined1 *)((long)pvVar6 + lVar46);
      local_1d0 = (undefined1 *)((long)pvVar6 + lVar46 + 3);
      local_1d8 = (undefined1 *)((long)pvVar6 + lVar46 + 1);
      local_318 = (undefined1 *)((long)pvVar6 + lVar47);
      local_1e0 = (undefined1 *)((long)pvVar6 + lVar47 + 3);
      local_1e8 = (undefined1 *)((long)pvVar6 + lVar47 + 1);
      local_320 = (undefined1 *)((long)pvVar6 + lVar48);
      local_1f0 = (undefined1 *)((long)pvVar6 + lVar48 + 3);
      local_1f8 = (undefined1 *)((long)pvVar6 + lVar48 + 1);
      puVar20 = (undefined1 *)((long)pvVar6 + lVar49);
      local_298 = (undefined1 *)((long)pvVar6 + lVar49 + 3);
      puVar31 = (undefined1 *)((long)pvVar6 + lVar49 + 1);
      puVar32 = (undefined1 *)((long)pvVar6 + lVar50);
      local_3b8 = (undefined1 *)((long)pvVar6 + lVar50 + 3);
      puVar38 = (undefined1 *)((long)pvVar6 + lVar50 + 1);
      puVar36 = (undefined1 *)((long)pvVar6 + lVar34);
      local_2a0 = (undefined1 *)((long)pvVar6 + lVar34 + 3);
      puVar67 = (undefined1 *)((long)pvVar6 + lVar34 + 1);
      puVar39 = (undefined1 *)((long)pvVar6 + lVar30);
      local_2a8 = (undefined1 *)((long)pvVar6 + lVar30 + 3);
      local_2b0 = (undefined1 *)((long)pvVar6 + lVar30 + 1);
      pvVar6 = (this->super_LSTM).weight_hc_data.data;
      local_240 = (undefined1 *)(((lVar23 + 3) * lVar40 + lVar52) * sVar4 + (long)pvVar6);
      local_248 = (undefined1 *)(((lVar27 + 3) * lVar40 + lVar52) * sVar4 + (long)pvVar6);
      local_250 = (undefined1 *)(((lVar22 + 3) * lVar40 + lVar52) * sVar4 + (long)pvVar6);
      local_370 = (undefined1 *)((lVar40 * 3 + lVar52) * sVar4 + (long)pvVar6);
      local_378 = (undefined1 *)(((lVar23 + 2) * lVar40 + lVar52) * sVar4 + (long)pvVar6);
      local_278 = (undefined1 *)(((lVar27 + 2) * lVar40 + lVar52) * sVar4 + (long)pvVar6);
      local_170 = (undefined1 *)(((lVar22 + 2) * lVar40 + lVar52) * sVar4 + (long)pvVar6);
      local_380 = (undefined1 *)((lVar52 + lVar40 * 2) * sVar4 + (long)pvVar6);
      local_328 = (undefined1 *)((long)pvVar6 + lVar63);
      local_200 = (undefined1 *)((long)pvVar6 + lVar63 + 3);
      local_208 = (undefined1 *)((long)pvVar6 + lVar63 + 1);
      local_330 = (undefined1 *)((long)pvVar6 + lVar66);
      local_210 = (undefined1 *)((long)pvVar6 + lVar66 + 3);
      local_218 = (undefined1 *)((long)pvVar6 + lVar66 + 1);
      local_338 = (undefined1 *)((long)pvVar6 + lVar37);
      local_220 = (undefined1 *)((long)pvVar6 + lVar37 + 3);
      local_228 = (undefined1 *)((long)pvVar6 + lVar37 + 1);
      local_340 = (undefined1 *)((long)pvVar6 + lVar16);
      local_230 = (undefined1 *)((long)pvVar6 + lVar16 + 3);
      local_238 = (undefined1 *)((long)pvVar6 + lVar16 + 1);
      puVar43 = (undefined1 *)((long)pvVar6 + lVar25);
      local_2b8 = (undefined1 *)((long)pvVar6 + lVar25 + 3);
      local_2c0 = (undefined1 *)((long)pvVar6 + lVar25 + 1);
      puVar55 = (undefined1 *)((long)pvVar6 + lVar57);
      local_2c8 = (undefined1 *)((long)pvVar6 + lVar57 + 3);
      local_2d0 = (undefined1 *)((long)pvVar6 + lVar57 + 1);
      puVar58 = (undefined1 *)((long)pvVar6 + lVar41);
      local_2d8 = (undefined1 *)((long)pvVar6 + lVar41 + 3);
      local_2e0 = (undefined1 *)((long)pvVar6 + lVar41 + 1);
      puVar62 = (undefined1 *)((long)pvVar6 + lVar53);
      local_2e8 = (undefined1 *)((long)pvVar6 + lVar53 + 3);
      local_2f0 = (undefined1 *)((long)pvVar6 + lVar53 + 1);
      pvVar6 = (this->super_LSTM).bias_c_data.data;
      lVar34 = (long)(this->super_LSTM).weight_xc_data_int8_scales.w * uVar65 *
               (this->super_LSTM).weight_xc_data_int8_scales.elemsize;
      pvVar7 = (this->super_LSTM).weight_xc_data_int8_scales.data;
      lVar37 = (long)(this->super_LSTM).weight_hc_data_int8_scales.w * uVar65 *
               (this->super_LSTM).weight_hc_data_int8_scales.elemsize;
      pvVar8 = (this->super_LSTM).weight_hc_data_int8_scales.data;
      lVar40 = (this->weight_data_tm).cstep * uVar65;
      puVar42 = (undefined8 *)
                ((this->bias_c_data_packed).cstep * uVar65 * (this->bias_c_data_packed).elemsize +
                (long)(this->bias_c_data_packed).data);
      sVar3 = (this->weight_data_tm).elemsize;
      lVar41 = lVar40 * sVar3;
      pvVar9 = (this->weight_data_tm_int8_descales).data;
      pvVar10 = (this->weight_data_tm).data;
      lVar29 = lVar44 + lVar24;
      lVar30 = lVar44 * 2 + lVar24;
      lVar33 = lVar44 * 3 + lVar24;
      lVar44 = (long)(this->weight_data_tm).w;
      lVar45 = sVar3 * lVar44;
      lVar16 = lVar15 * 4;
      lVar25 = lVar51 * 4;
      uVar26 = 0;
      local_148 = 0;
      local_150 = 0;
      local_3f8 = puVar20;
      local_3f0 = puVar32;
      local_3e8 = puVar36;
      local_3e0 = puVar39;
      local_3d8 = puVar43;
      local_3d0 = puVar55;
      local_3c8 = puVar58;
      local_3c0 = puVar62;
      for (uVar61 = 0; (long)(uVar61 | 3) < lVar22; uVar61 = uVar61 + 4) {
        puVar60 = (undefined8 *)((long)pvVar6 + uVar61 * 4 + lVar24);
        uVar11 = puVar60[1];
        *puVar42 = *puVar60;
        puVar42[1] = uVar11;
        puVar60 = (undefined8 *)((long)pvVar6 + uVar61 * 4 + lVar29);
        uVar11 = puVar60[1];
        puVar42[2] = *puVar60;
        puVar42[3] = uVar11;
        puVar60 = (undefined8 *)((long)pvVar6 + uVar61 * 4 + lVar30);
        uVar11 = puVar60[1];
        puVar42[4] = *puVar60;
        puVar42[5] = uVar11;
        puVar60 = (undefined8 *)((long)pvVar6 + uVar61 * 4 + lVar33);
        uVar11 = puVar60[1];
        puVar42[6] = *puVar60;
        puVar42[7] = uVar11;
        puVar60 = (undefined8 *)((long)pvVar10 + (uVar61 >> 2) * lVar45 + lVar41);
        local_458 = local_368;
        local_460 = local_3b0;
        local_488 = local_318;
        local_480 = local_360;
        local_478 = local_408;
        local_440 = local_400;
        local_450 = local_3f0;
        local_468 = local_3f8;
        puVar17 = puVar64;
        lVar46 = local_150;
        local_428 = local_310;
        local_430 = local_320;
        local_448 = local_358;
        puVar59 = local_3e8;
        puVar68 = local_3e0;
        local_438 = local_350;
        local_470 = puVar35;
        for (lVar47 = 0; lVar47 + 7 < lVar14; lVar47 = lVar47 + 8) {
          *puVar60 = *(undefined8 *)(local_3e0 + lVar47);
          puVar60[1] = *(undefined8 *)(local_3e8 + lVar47);
          puVar60[2] = *(undefined8 *)(local_3f0 + lVar47);
          puVar60[3] = *(undefined8 *)(local_3f8 + lVar47);
          puVar60[4] = *(undefined8 *)(local_320 + lVar47);
          puVar60[5] = *(undefined8 *)(local_318 + lVar47);
          puVar60[6] = *(undefined8 *)(local_310 + lVar47);
          puVar60[7] = *(undefined8 *)(puVar35 + lVar47);
          puVar60[8] = *(undefined8 *)(local_368 + lVar47);
          puVar60[9] = *(undefined8 *)(local_360 + lVar47);
          puVar60[10] = *(undefined8 *)(local_358 + lVar47);
          puVar60[0xb] = *(undefined8 *)(local_350 + lVar47);
          puVar60[0xc] = *(undefined8 *)(local_3b0 + lVar47);
          puVar60[0xd] = *(undefined8 *)(local_408 + lVar47);
          puVar60[0xe] = *(undefined8 *)(local_400 + lVar47);
          puVar60[0xf] = *(undefined8 *)(puVar64 + lVar47);
          puVar60 = puVar60 + 0x10;
          lVar46 = lVar46 + 8;
          local_468 = local_468 + 8;
          local_450 = local_450 + 8;
          puVar59 = puVar59 + 8;
          puVar68 = puVar68 + 8;
          puVar17 = puVar17 + 8;
          local_438 = local_438 + 8;
          local_470 = local_470 + 8;
          local_440 = local_440 + 8;
          local_448 = local_448 + 8;
          local_428 = local_428 + 8;
          local_478 = local_478 + 8;
          local_480 = local_480 + 8;
          local_488 = local_488 + 8;
          local_460 = local_460 + 8;
          local_458 = local_458 + 8;
          local_430 = local_430 + 8;
        }
        lVar48 = (uVar61 >> 2) * lVar28;
        for (; puVar54 = local_458, lVar47 + 3 < lVar14; lVar47 = lVar47 + 4) {
          *(undefined1 *)puVar60 = puVar39[lVar46];
          *(undefined1 *)((long)puVar60 + 1) = puVar39[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 2) = puVar39[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 3) = puVar39[lVar46 + 3];
          lVar49 = lVar15 + lVar46;
          *(undefined1 *)((long)puVar60 + 4) = puVar39[lVar15 + lVar46];
          *(undefined1 *)((long)puVar60 + 5) = puVar39[lVar15 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 6) = puVar39[lVar15 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 7) = puVar39[lVar15 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 1) = puVar36[lVar46];
          *(undefined1 *)((long)puVar60 + 9) = puVar36[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 10) = puVar36[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 0xb) = puVar36[lVar46 + 3];
          *(undefined1 *)((long)puVar60 + 0xc) = puVar36[lVar15 + lVar46];
          *(undefined1 *)((long)puVar60 + 0xd) = puVar36[lVar15 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 0xe) = puVar36[lVar15 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 0xf) = puVar36[lVar15 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 2) = puVar32[lVar46];
          *(undefined1 *)((long)puVar60 + 0x11) = puVar32[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 0x12) = puVar32[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 0x13) = puVar32[lVar46 + 3];
          *(undefined1 *)((long)puVar60 + 0x14) = puVar32[lVar15 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x15) = puVar32[lVar15 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x16) = puVar32[lVar15 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x17) = puVar32[lVar15 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 3) = puVar20[lVar46];
          *(undefined1 *)((long)puVar60 + 0x19) = puVar20[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 0x1a) = puVar20[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 0x1b) = puVar20[lVar46 + 3];
          *(undefined1 *)((long)puVar60 + 0x1c) = puVar20[lVar15 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x1d) = puVar20[lVar15 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x1e) = puVar20[lVar15 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x1f) = puVar20[lVar15 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 4) = puVar39[lVar15 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x21) = puVar39[lVar15 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x22) = puVar39[lVar15 + 2 + lVar49];
          lVar50 = lVar15 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x23) = puVar39[lVar15 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x24) = puVar39[lVar15 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x25) = puVar39[lVar15 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x26) = puVar39[lVar15 + 2 + lVar50];
          lVar49 = lVar15 + lVar46;
          *(undefined1 *)((long)puVar60 + 0x27) = puVar39[lVar15 + 3 + lVar50];
          *(undefined1 *)(puVar60 + 5) = puVar36[lVar15 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x29) = puVar36[lVar15 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x2a) = puVar36[lVar15 + 2 + lVar49];
          lVar50 = lVar15 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x2b) = puVar36[lVar15 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x2c) = puVar36[lVar15 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x2d) = puVar36[lVar15 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x2e) = puVar36[lVar15 + 2 + lVar50];
          lVar49 = lVar15 + lVar46;
          *(undefined1 *)((long)puVar60 + 0x2f) = puVar36[lVar15 + 3 + lVar50];
          *(undefined1 *)(puVar60 + 6) = puVar32[lVar15 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x31) = puVar32[lVar15 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x32) = puVar32[lVar15 + 2 + lVar49];
          lVar50 = lVar15 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x33) = puVar32[lVar15 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x34) = puVar32[lVar15 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x35) = puVar32[lVar15 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x36) = puVar32[lVar15 + 2 + lVar50];
          lVar49 = lVar15 + lVar46;
          *(undefined1 *)((long)puVar60 + 0x37) = puVar32[lVar15 + 3 + lVar50];
          *(undefined1 *)(puVar60 + 7) = puVar20[lVar15 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x39) = puVar20[lVar15 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x3a) = puVar20[lVar15 + 2 + lVar49];
          lVar50 = lVar15 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x3b) = puVar20[lVar15 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x3c) = puVar20[lVar15 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x3d) = puVar20[lVar15 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x3e) = puVar20[lVar15 + 2 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x3f) = puVar20[lVar15 + 3 + lVar50];
          puVar60 = puVar60 + 8;
          lVar46 = lVar46 + 4;
          local_468 = local_468 + 4;
          local_450 = local_450 + 4;
          puVar59 = puVar59 + 4;
          puVar68 = puVar68 + 4;
          puVar17 = puVar17 + 4;
          local_438 = local_438 + 4;
          local_470 = local_470 + 4;
          local_440 = local_440 + 4;
          local_448 = local_448 + 4;
          local_428 = local_428 + 4;
          local_478 = local_478 + 4;
          local_480 = local_480 + 4;
          local_488 = local_488 + 4;
          local_460 = local_460 + 4;
          local_458 = local_458 + 4;
          local_430 = local_430 + 4;
        }
        for (; lVar47 + 1 < lVar14; lVar47 = lVar47 + 2) {
          *(undefined1 *)puVar60 = *puVar68;
          *(undefined1 *)((long)puVar60 + 1) = puVar68[1];
          *(undefined1 *)((long)puVar60 + 2) = puVar68[lVar15];
          *(undefined1 *)((long)puVar60 + 3) = puVar68[lVar15 + 1];
          *(undefined1 *)((long)puVar60 + 4) = puVar68[lVar15 * 2];
          *(undefined1 *)((long)puVar60 + 5) = puVar68[lVar15 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 6) = puVar68[lVar15 * 3];
          *(undefined1 *)((long)puVar60 + 7) = puVar68[lVar15 * 3 + 1];
          *(undefined1 *)(puVar60 + 1) = *puVar59;
          *(undefined1 *)((long)puVar60 + 9) = puVar59[1];
          *(undefined1 *)((long)puVar60 + 10) = puVar59[lVar15];
          *(undefined1 *)((long)puVar60 + 0xb) = puVar59[lVar15 + 1];
          *(undefined1 *)((long)puVar60 + 0xc) = puVar59[lVar15 * 2];
          *(undefined1 *)((long)puVar60 + 0xd) = puVar59[lVar15 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 0xe) = puVar59[lVar15 * 3];
          *(undefined1 *)((long)puVar60 + 0xf) = puVar59[lVar15 * 3 + 1];
          *(undefined1 *)(puVar60 + 2) = *local_450;
          *(undefined1 *)((long)puVar60 + 0x11) = local_450[1];
          *(undefined1 *)((long)puVar60 + 0x12) = local_450[lVar15];
          *(undefined1 *)((long)puVar60 + 0x13) = local_450[lVar15 + 1];
          *(undefined1 *)((long)puVar60 + 0x14) = local_450[lVar15 * 2];
          *(undefined1 *)((long)puVar60 + 0x15) = local_450[lVar15 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 0x16) = local_450[lVar15 * 3];
          *(undefined1 *)((long)puVar60 + 0x17) = local_450[lVar15 * 3 + 1];
          *(undefined1 *)(puVar60 + 3) = *local_468;
          *(undefined1 *)((long)puVar60 + 0x19) = local_468[1];
          *(undefined1 *)((long)puVar60 + 0x1a) = local_468[lVar15];
          *(undefined1 *)((long)puVar60 + 0x1b) = local_468[lVar15 + 1];
          *(undefined1 *)((long)puVar60 + 0x1c) = local_468[lVar15 * 2];
          *(undefined1 *)((long)puVar60 + 0x1d) = local_468[lVar15 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 0x1e) = local_468[lVar15 * 3];
          *(undefined1 *)((long)puVar60 + 0x1f) = local_468[lVar15 * 3 + 1];
          puVar60 = puVar60 + 4;
          local_468 = local_468 + 2;
          local_450 = local_450 + 2;
          puVar59 = puVar59 + 2;
          puVar68 = puVar68 + 2;
          puVar17 = puVar17 + 2;
          local_438 = local_438 + 2;
          local_470 = local_470 + 2;
          local_440 = local_440 + 2;
          local_448 = local_448 + 2;
          local_428 = local_428 + 2;
          local_478 = local_478 + 2;
          local_480 = local_480 + 2;
          local_488 = local_488 + 2;
          local_460 = local_460 + 2;
          local_430 = local_430 + 2;
          puVar54 = puVar54 + 2;
        }
        local_458 = puVar17;
        for (lVar46 = 0; lVar47 + lVar46 < lVar14; lVar46 = lVar46 + 1) {
          *(undefined1 *)puVar60 = puVar68[lVar46];
          *(undefined1 *)((long)puVar60 + 1) = *local_430;
          *(undefined1 *)((long)puVar60 + 2) = *puVar54;
          *(undefined1 *)((long)puVar60 + 3) = *local_460;
          *(undefined1 *)((long)puVar60 + 4) = puVar59[lVar46];
          *(undefined1 *)((long)puVar60 + 5) = *local_488;
          *(undefined1 *)((long)puVar60 + 6) = *local_480;
          *(undefined1 *)((long)puVar60 + 7) = *local_478;
          *(undefined1 *)(puVar60 + 1) = local_450[lVar46];
          *(undefined1 *)((long)puVar60 + 9) = *local_428;
          *(undefined1 *)((long)puVar60 + 10) = *local_448;
          *(undefined1 *)((long)puVar60 + 0xb) = *local_440;
          *(undefined1 *)((long)puVar60 + 0xc) = local_468[lVar46];
          *(undefined1 *)((long)puVar60 + 0xd) = *local_470;
          *(undefined1 *)((long)puVar60 + 0xe) = *local_438;
          *(undefined1 *)((long)puVar60 + 0xf) = *local_458;
          puVar60 = puVar60 + 2;
          local_458 = local_458 + 1;
          local_438 = local_438 + 1;
          local_470 = local_470 + 1;
          local_440 = local_440 + 1;
          local_448 = local_448 + 1;
          local_428 = local_428 + 1;
          local_478 = local_478 + 1;
          local_480 = local_480 + 1;
          local_488 = local_488 + 1;
          local_460 = local_460 + 1;
          puVar54 = puVar54 + 1;
          local_430 = local_430 + 1;
        }
        local_488 = local_380;
        local_458 = local_370;
        local_440 = local_338;
        local_480 = local_170;
        local_478 = local_250;
        local_428 = local_278;
        local_468 = local_248;
        local_470 = local_3c0;
        local_460 = local_3d0;
        local_e8 = local_330;
        puVar17 = local_240;
        local_450 = local_3d8;
        lVar46 = local_148;
        puVar59 = local_378;
        local_430 = local_328;
        local_438 = local_3c8;
        local_448 = local_340;
        for (lVar47 = 0; lVar47 + 7 < lVar13; lVar47 = lVar47 + 8) {
          *puVar60 = *(undefined8 *)(local_3c0 + lVar47);
          puVar60[1] = *(undefined8 *)(local_3c8 + lVar47);
          puVar60[2] = *(undefined8 *)(local_3d0 + lVar47);
          puVar60[3] = *(undefined8 *)(local_3d8 + lVar47);
          puVar60[4] = *(undefined8 *)(local_340 + lVar47);
          puVar60[5] = *(undefined8 *)(local_338 + lVar47);
          puVar60[6] = *(undefined8 *)(local_330 + lVar47);
          puVar60[7] = *(undefined8 *)(local_328 + lVar47);
          puVar60[8] = *(undefined8 *)(local_380 + lVar47);
          puVar60[9] = *(undefined8 *)(local_170 + lVar47);
          puVar60[10] = *(undefined8 *)(local_278 + lVar47);
          puVar60[0xb] = *(undefined8 *)(local_378 + lVar47);
          puVar60[0xc] = *(undefined8 *)(local_370 + lVar47);
          puVar60[0xd] = *(undefined8 *)(local_250 + lVar47);
          puVar60[0xe] = *(undefined8 *)(local_248 + lVar47);
          puVar60[0xf] = *(undefined8 *)(local_240 + lVar47);
          puVar60 = puVar60 + 0x10;
          lVar46 = lVar46 + 8;
          local_450 = local_450 + 8;
          local_460 = local_460 + 8;
          local_438 = local_438 + 8;
          local_470 = local_470 + 8;
          puVar17 = puVar17 + 8;
          puVar59 = puVar59 + 8;
          local_430 = local_430 + 8;
          local_468 = local_468 + 8;
          local_428 = local_428 + 8;
          local_e8 = local_e8 + 8;
          local_478 = local_478 + 8;
          local_480 = local_480 + 8;
          local_440 = local_440 + 8;
          local_458 = local_458 + 8;
          local_488 = local_488 + 8;
          local_448 = local_448 + 8;
        }
        for (; puVar68 = local_440, puVar54 = local_458, lVar47 + 3 < lVar13; lVar47 = lVar47 + 4) {
          *(undefined1 *)puVar60 = puVar62[lVar46];
          *(undefined1 *)((long)puVar60 + 1) = puVar62[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 2) = puVar62[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 3) = puVar62[lVar46 + 3];
          lVar49 = lVar51 + lVar46;
          *(undefined1 *)((long)puVar60 + 4) = puVar62[lVar51 + lVar46];
          *(undefined1 *)((long)puVar60 + 5) = puVar62[lVar51 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 6) = puVar62[lVar51 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 7) = puVar62[lVar51 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 1) = puVar58[lVar46];
          *(undefined1 *)((long)puVar60 + 9) = puVar58[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 10) = puVar58[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 0xb) = puVar58[lVar46 + 3];
          *(undefined1 *)((long)puVar60 + 0xc) = puVar58[lVar51 + lVar46];
          *(undefined1 *)((long)puVar60 + 0xd) = puVar58[lVar51 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 0xe) = puVar58[lVar51 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 0xf) = puVar58[lVar51 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 2) = puVar55[lVar46];
          *(undefined1 *)((long)puVar60 + 0x11) = puVar55[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 0x12) = puVar55[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 0x13) = puVar55[lVar46 + 3];
          *(undefined1 *)((long)puVar60 + 0x14) = puVar55[lVar51 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x15) = puVar55[lVar51 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x16) = puVar55[lVar51 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x17) = puVar55[lVar51 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 3) = puVar43[lVar46];
          *(undefined1 *)((long)puVar60 + 0x19) = puVar43[lVar46 + 1];
          *(undefined1 *)((long)puVar60 + 0x1a) = puVar43[lVar46 + 2];
          *(undefined1 *)((long)puVar60 + 0x1b) = puVar43[lVar46 + 3];
          *(undefined1 *)((long)puVar60 + 0x1c) = puVar43[lVar51 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x1d) = puVar43[lVar51 + 1 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x1e) = puVar43[lVar51 + 2 + lVar46];
          *(undefined1 *)((long)puVar60 + 0x1f) = puVar43[lVar51 + 3 + lVar46];
          *(undefined1 *)(puVar60 + 4) = puVar62[lVar51 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x21) = puVar62[lVar51 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x22) = puVar62[lVar51 + 2 + lVar49];
          lVar50 = lVar51 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x23) = puVar62[lVar51 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x24) = puVar62[lVar51 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x25) = puVar62[lVar51 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x26) = puVar62[lVar51 + 2 + lVar50];
          lVar49 = lVar51 + lVar46;
          *(undefined1 *)((long)puVar60 + 0x27) = puVar62[lVar51 + 3 + lVar50];
          *(undefined1 *)(puVar60 + 5) = puVar58[lVar51 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x29) = puVar58[lVar51 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x2a) = puVar58[lVar51 + 2 + lVar49];
          lVar50 = lVar51 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x2b) = puVar58[lVar51 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x2c) = puVar58[lVar51 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x2d) = puVar58[lVar51 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x2e) = puVar58[lVar51 + 2 + lVar50];
          lVar49 = lVar51 + lVar46;
          *(undefined1 *)((long)puVar60 + 0x2f) = puVar58[lVar51 + 3 + lVar50];
          *(undefined1 *)(puVar60 + 6) = puVar55[lVar51 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x31) = puVar55[lVar51 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x32) = puVar55[lVar51 + 2 + lVar49];
          lVar50 = lVar51 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x33) = puVar55[lVar51 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x34) = puVar55[lVar51 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x35) = puVar55[lVar51 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x36) = puVar55[lVar51 + 2 + lVar50];
          lVar49 = lVar51 + lVar46;
          *(undefined1 *)((long)puVar60 + 0x37) = puVar55[lVar51 + 3 + lVar50];
          *(undefined1 *)(puVar60 + 7) = puVar43[lVar51 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x39) = puVar43[lVar51 + 1 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x3a) = puVar43[lVar51 + 2 + lVar49];
          lVar50 = lVar51 + lVar49;
          *(undefined1 *)((long)puVar60 + 0x3b) = puVar43[lVar51 + 3 + lVar49];
          *(undefined1 *)((long)puVar60 + 0x3c) = puVar43[lVar51 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x3d) = puVar43[lVar51 + 1 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x3e) = puVar43[lVar51 + 2 + lVar50];
          *(undefined1 *)((long)puVar60 + 0x3f) = puVar43[lVar51 + 3 + lVar50];
          puVar60 = puVar60 + 8;
          lVar46 = lVar46 + 4;
          local_450 = local_450 + 4;
          local_460 = local_460 + 4;
          local_438 = local_438 + 4;
          local_470 = local_470 + 4;
          puVar17 = puVar17 + 4;
          puVar59 = puVar59 + 4;
          local_430 = local_430 + 4;
          local_468 = local_468 + 4;
          local_428 = local_428 + 4;
          local_e8 = local_e8 + 4;
          local_478 = local_478 + 4;
          local_480 = local_480 + 4;
          local_440 = local_440 + 4;
          local_458 = local_458 + 4;
          local_488 = local_488 + 4;
          local_448 = local_448 + 4;
        }
        for (; lVar47 + 1 < lVar13; lVar47 = lVar47 + 2) {
          *(undefined1 *)puVar60 = *local_470;
          *(undefined1 *)((long)puVar60 + 1) = local_470[1];
          *(undefined1 *)((long)puVar60 + 2) = local_470[lVar51];
          *(undefined1 *)((long)puVar60 + 3) = local_470[lVar51 + 1];
          *(undefined1 *)((long)puVar60 + 4) = local_470[lVar51 * 2];
          *(undefined1 *)((long)puVar60 + 5) = local_470[lVar51 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 6) = local_470[lVar51 * 3];
          *(undefined1 *)((long)puVar60 + 7) = local_470[lVar51 * 3 + 1];
          *(undefined1 *)(puVar60 + 1) = *local_438;
          *(undefined1 *)((long)puVar60 + 9) = local_438[1];
          *(undefined1 *)((long)puVar60 + 10) = local_438[lVar51];
          *(undefined1 *)((long)puVar60 + 0xb) = local_438[lVar51 + 1];
          *(undefined1 *)((long)puVar60 + 0xc) = local_438[lVar51 * 2];
          *(undefined1 *)((long)puVar60 + 0xd) = local_438[lVar51 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 0xe) = local_438[lVar51 * 3];
          *(undefined1 *)((long)puVar60 + 0xf) = local_438[lVar51 * 3 + 1];
          *(undefined1 *)(puVar60 + 2) = *local_460;
          *(undefined1 *)((long)puVar60 + 0x11) = local_460[1];
          *(undefined1 *)((long)puVar60 + 0x12) = local_460[lVar51];
          *(undefined1 *)((long)puVar60 + 0x13) = local_460[lVar51 + 1];
          *(undefined1 *)((long)puVar60 + 0x14) = local_460[lVar51 * 2];
          *(undefined1 *)((long)puVar60 + 0x15) = local_460[lVar51 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 0x16) = local_460[lVar51 * 3];
          *(undefined1 *)((long)puVar60 + 0x17) = local_460[lVar51 * 3 + 1];
          *(undefined1 *)(puVar60 + 3) = *local_450;
          *(undefined1 *)((long)puVar60 + 0x19) = local_450[1];
          *(undefined1 *)((long)puVar60 + 0x1a) = local_450[lVar51];
          *(undefined1 *)((long)puVar60 + 0x1b) = local_450[lVar51 + 1];
          *(undefined1 *)((long)puVar60 + 0x1c) = local_450[lVar51 * 2];
          *(undefined1 *)((long)puVar60 + 0x1d) = local_450[lVar51 * 2 + 1];
          *(undefined1 *)((long)puVar60 + 0x1e) = local_450[lVar51 * 3];
          *(undefined1 *)((long)puVar60 + 0x1f) = local_450[lVar51 * 3 + 1];
          puVar60 = puVar60 + 4;
          local_450 = local_450 + 2;
          local_460 = local_460 + 2;
          local_438 = local_438 + 2;
          local_470 = local_470 + 2;
          puVar17 = puVar17 + 2;
          puVar59 = puVar59 + 2;
          local_430 = local_430 + 2;
          local_468 = local_468 + 2;
          local_428 = local_428 + 2;
          local_e8 = local_e8 + 2;
          local_478 = local_478 + 2;
          local_480 = local_480 + 2;
          local_488 = local_488 + 2;
          local_448 = local_448 + 2;
          puVar68 = puVar68 + 2;
          puVar54 = puVar54 + 2;
        }
        local_458 = puVar59;
        local_440 = puVar17;
        for (lVar46 = 0; lVar46 + lVar47 < lVar13; lVar46 = lVar46 + 1) {
          *(undefined1 *)puVar60 = local_470[lVar46];
          *(undefined1 *)((long)puVar60 + 1) = *local_448;
          *(undefined1 *)((long)puVar60 + 2) = *local_488;
          *(undefined1 *)((long)puVar60 + 3) = *puVar54;
          *(undefined1 *)((long)puVar60 + 4) = local_438[lVar46];
          *(undefined1 *)((long)puVar60 + 5) = *puVar68;
          *(undefined1 *)((long)puVar60 + 6) = *local_480;
          *(undefined1 *)((long)puVar60 + 7) = *local_478;
          *(undefined1 *)(puVar60 + 1) = local_460[lVar46];
          *(undefined1 *)((long)puVar60 + 9) = *local_e8;
          *(undefined1 *)((long)puVar60 + 10) = *local_428;
          *(undefined1 *)((long)puVar60 + 0xb) = *local_468;
          *(undefined1 *)((long)puVar60 + 0xc) = local_450[lVar46];
          *(undefined1 *)((long)puVar60 + 0xd) = *local_430;
          *(undefined1 *)((long)puVar60 + 0xe) = *local_458;
          *(undefined1 *)((long)puVar60 + 0xf) = *local_440;
          local_440 = local_440 + 1;
          local_458 = local_458 + 1;
          local_430 = local_430 + 1;
          local_468 = local_468 + 1;
          local_428 = local_428 + 1;
          local_e8 = local_e8 + 1;
          local_478 = local_478 + 1;
          local_480 = local_480 + 1;
          puVar68 = puVar68 + 1;
          puVar54 = puVar54 + 1;
          local_488 = local_488 + 1;
          local_448 = local_448 + 1;
          puVar60 = puVar60 + 2;
        }
        puVar60 = (undefined8 *)((long)pvVar6 + uVar61 * 4 + lVar24);
        uVar11 = puVar60[1];
        puVar42[8] = *puVar60;
        puVar42[9] = uVar11;
        auVar72._16_16_ = *(undefined1 (*) [16])((long)pvVar7 + uVar61 * 4 + lVar23 * 4 + lVar34);
        auVar72._0_16_ = *(undefined1 (*) [16])((long)pvVar7 + uVar61 * 4 + lVar27 * 4 + lVar34);
        auVar73._16_16_ = *(undefined1 (*) [16])((long)pvVar8 + uVar61 * 4 + lVar23 * 4 + lVar37);
        auVar73._0_16_ = *(undefined1 (*) [16])((long)pvVar8 + uVar61 * 4 + lVar27 * 4 + lVar37);
        auVar70 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                  ((long)pvVar7 + uVar61 * 4 + lVar22 * 4 + lVar34),
                                                 *(undefined1 (*) [16])
                                                  ((long)pvVar7 + uVar61 * 4 + lVar34))),auVar72,1);
        auVar70 = vdivps_avx512f(auVar69,auVar70);
        auVar71 = vinsertf64x4_avx512f
                            (ZEXT3264(CONCAT1616(*(undefined1 (*) [16])
                                                  ((long)pvVar8 + uVar61 * 4 + lVar22 * 4 + lVar37),
                                                 *(undefined1 (*) [16])
                                                  ((long)pvVar8 + uVar61 * 4 + lVar37))),auVar73,1);
        auVar71 = vdivps_avx512f(auVar69,auVar71);
        *(undefined1 (*) [64])((long)pvVar9 + lVar48 + lVar56) = auVar70;
        *(undefined1 (*) [64])((long)pvVar9 + lVar48 + lVar56 + 0x40) = auVar71;
        puVar42 = puVar42 + 8;
        puVar64 = puVar64 + lVar16;
        local_400 = local_400 + lVar16;
        local_408 = local_408 + lVar16;
        local_3b0 = local_3b0 + lVar16;
        local_350 = local_350 + lVar16;
        local_358 = local_358 + lVar16;
        local_360 = local_360 + lVar16;
        local_368 = local_368 + lVar16;
        puVar35 = puVar35 + lVar16;
        local_310 = local_310 + lVar16;
        local_318 = local_318 + lVar16;
        local_320 = local_320 + lVar16;
        local_3f8 = local_3f8 + lVar16;
        local_3f0 = local_3f0 + lVar16;
        local_3e8 = local_3e8 + lVar16;
        local_3e0 = local_3e0 + lVar16;
        local_150 = local_150 + lVar16;
        local_240 = local_240 + lVar25;
        local_248 = local_248 + lVar25;
        local_250 = local_250 + lVar25;
        local_370 = local_370 + lVar25;
        local_378 = local_378 + lVar25;
        local_278 = local_278 + lVar25;
        local_170 = local_170 + lVar25;
        local_380 = local_380 + lVar25;
        local_328 = local_328 + lVar25;
        local_330 = local_330 + lVar25;
        local_338 = local_338 + lVar25;
        local_340 = local_340 + lVar25;
        local_3d8 = local_3d8 + lVar25;
        local_3d0 = local_3d0 + lVar25;
        local_3c8 = local_3c8 + lVar25;
        local_3c0 = local_3c0 + lVar25;
        local_148 = local_148 + lVar25;
        uVar26 = (ulong)((int)uVar26 + 4);
        local_1c0 = local_1c0 + lVar16;
        local_1d0 = local_1d0 + lVar16;
        local_298 = local_298 + lVar16;
        local_3b8 = local_3b8 + lVar16;
        local_1e0 = local_1e0 + lVar16;
        local_1f0 = local_1f0 + lVar16;
        local_2a0 = local_2a0 + lVar16;
        local_2a8 = local_2a8 + lVar16;
        local_1c8 = local_1c8 + lVar16;
        local_1d8 = local_1d8 + lVar16;
        local_1e8 = local_1e8 + lVar16;
        local_1f8 = local_1f8 + lVar16;
        puVar31 = puVar31 + lVar16;
        puVar38 = puVar38 + lVar16;
        puVar67 = puVar67 + lVar16;
        local_2b0 = local_2b0 + lVar16;
        local_200 = local_200 + lVar25;
        local_210 = local_210 + lVar25;
        local_2b8 = local_2b8 + lVar25;
        local_2c8 = local_2c8 + lVar25;
        local_220 = local_220 + lVar25;
        local_230 = local_230 + lVar25;
        local_2d8 = local_2d8 + lVar25;
        local_2e8 = local_2e8 + lVar25;
        local_208 = local_208 + lVar25;
        local_218 = local_218 + lVar25;
        local_228 = local_228 + lVar25;
        local_238 = local_238 + lVar25;
        local_2c0 = local_2c0 + lVar25;
        local_2d0 = local_2d0 + lVar25;
        local_2e0 = local_2e0 + lVar25;
        local_2f0 = local_2f0 + lVar25;
      }
      lVar16 = lVar15 * 2;
      lVar25 = lVar51 * 2;
      uVar21 = 0;
      for (; uVar18 = uVar61 | 1, (long)uVar18 < lVar22; uVar61 = uVar61 + 2) {
        lVar50 = ((ulong)((uVar21 & 1) + (int)(uVar26 >> 2)) * lVar44 + lVar40) * sVar3;
        *(undefined4 *)puVar42 = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar24);
        *(undefined4 *)((long)puVar42 + 4) = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar29);
        *(undefined4 *)(puVar42 + 1) = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar30);
        *(undefined4 *)((long)puVar42 + 0xc) = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar33);
        *(undefined4 *)(puVar42 + 2) = *(undefined4 *)((long)pvVar6 + uVar18 * 4 + lVar24);
        *(undefined4 *)((long)puVar42 + 0x14) = *(undefined4 *)((long)pvVar6 + uVar18 * 4 + lVar29);
        *(undefined4 *)(puVar42 + 3) = *(undefined4 *)((long)pvVar6 + uVar18 * 4 + lVar30);
        *(undefined4 *)((long)puVar42 + 0x1c) = *(undefined4 *)((long)pvVar6 + uVar18 * 4 + lVar33);
        lVar46 = uVar61 + lVar22;
        lVar48 = lVar23 + uVar61;
        lVar47 = lVar27 + uVar61 + 1;
        uVar19 = (ulong)(((uint)(uVar61 >> 2) & 0x3fffffff) + (uint)(((uint)uVar61 >> 1 & 1) != 0));
        puVar17 = (undefined1 *)((long)pvVar10 + lVar45 * uVar19 + lVar41);
        local_458 = local_3e8;
        local_440 = local_3f0;
        local_488 = local_3f8;
        local_480 = local_320;
        local_428 = local_318;
        local_478 = local_310;
        local_470 = local_2b0;
        local_450 = local_1e8;
        local_430 = local_1d8;
        local_438 = local_1c8;
        puVar20 = local_1d0;
        puVar32 = local_1c0;
        puVar36 = local_298;
        puVar39 = local_2a8;
        puVar43 = local_3b8;
        puVar55 = local_1e0;
        puVar58 = local_2a0;
        puVar62 = local_1f0;
        local_408 = local_3e0;
        local_400 = local_1f8;
        puVar64 = puVar31;
        local_468 = puVar35;
        local_460 = puVar67;
        local_448 = puVar38;
        for (lVar49 = 0; lVar49 + 7 < lVar14; lVar49 = lVar49 + 8) {
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50) = *(undefined8 *)(local_3e0 + lVar49)
          ;
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 8) =
               *(undefined8 *)(local_320 + lVar49);
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 0x10) =
               *(undefined8 *)(local_3e8 + lVar49);
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 0x18) =
               *(undefined8 *)(local_318 + lVar49);
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 0x20) =
               *(undefined8 *)(local_3f0 + lVar49);
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 0x28) =
               *(undefined8 *)(local_310 + lVar49);
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 0x30) =
               *(undefined8 *)(local_3f8 + lVar49);
          *(undefined8 *)((long)pvVar10 + lVar49 * 8 + lVar50 + 0x38) =
               *(undefined8 *)(puVar35 + lVar49);
          puVar17 = puVar17 + 0x40;
          puVar32 = puVar32 + 8;
          puVar20 = puVar20 + 8;
          puVar36 = puVar36 + 8;
          puVar43 = puVar43 + 8;
          puVar55 = puVar55 + 8;
          puVar62 = puVar62 + 8;
          puVar58 = puVar58 + 8;
          puVar39 = puVar39 + 8;
          local_438 = local_438 + 8;
          local_430 = local_430 + 8;
          local_450 = local_450 + 8;
          local_400 = local_400 + 8;
          puVar64 = puVar64 + 8;
          local_448 = local_448 + 8;
          local_460 = local_460 + 8;
          local_470 = local_470 + 8;
          local_468 = local_468 + 8;
          local_478 = local_478 + 8;
          local_428 = local_428 + 8;
          local_480 = local_480 + 8;
          local_488 = local_488 + 8;
          local_440 = local_440 + 8;
          local_458 = local_458 + 8;
          local_408 = local_408 + 8;
        }
        lVar50 = uVar19 * lVar28;
        for (; lVar49 + 3 < lVar14; lVar49 = lVar49 + 4) {
          *puVar17 = puVar39[-3];
          puVar17[1] = puVar39[-2];
          puVar17[2] = puVar39[-1];
          puVar17[3] = *puVar39;
          puVar17[4] = puVar58[-3];
          puVar17[5] = puVar58[-2];
          puVar17[6] = puVar58[-1];
          puVar17[7] = *puVar58;
          puVar17[8] = puVar62[-3];
          puVar17[9] = puVar62[-2];
          puVar17[10] = puVar62[-1];
          puVar17[0xb] = *puVar62;
          puVar17[0xc] = puVar55[-3];
          puVar17[0xd] = puVar55[-2];
          puVar17[0xe] = puVar55[-1];
          puVar17[0xf] = *puVar55;
          puVar17[0x10] = puVar43[-3];
          puVar17[0x11] = puVar43[-2];
          puVar17[0x12] = puVar43[-1];
          puVar17[0x13] = *puVar43;
          puVar17[0x14] = puVar36[-3];
          puVar17[0x15] = puVar36[-2];
          puVar17[0x16] = puVar36[-1];
          puVar17[0x17] = *puVar36;
          puVar17[0x18] = puVar20[-3];
          puVar17[0x19] = puVar20[-2];
          puVar17[0x1a] = puVar20[-1];
          puVar17[0x1b] = *puVar20;
          puVar17[0x1c] = puVar32[-3];
          puVar17[0x1d] = puVar32[-2];
          puVar17[0x1e] = puVar32[-1];
          puVar17[0x1f] = *puVar32;
          puVar17 = puVar17 + 0x20;
          puVar32 = puVar32 + 4;
          puVar20 = puVar20 + 4;
          puVar36 = puVar36 + 4;
          puVar43 = puVar43 + 4;
          puVar55 = puVar55 + 4;
          puVar62 = puVar62 + 4;
          puVar58 = puVar58 + 4;
          puVar39 = puVar39 + 4;
          local_438 = local_438 + 4;
          local_430 = local_430 + 4;
          local_450 = local_450 + 4;
          local_400 = local_400 + 4;
          puVar64 = puVar64 + 4;
          local_448 = local_448 + 4;
          local_460 = local_460 + 4;
          local_470 = local_470 + 4;
          local_468 = local_468 + 4;
          local_478 = local_478 + 4;
          local_428 = local_428 + 4;
          local_480 = local_480 + 4;
          local_488 = local_488 + 4;
          local_440 = local_440 + 4;
          local_458 = local_458 + 4;
          local_408 = local_408 + 4;
        }
        for (; lVar49 + 1 < lVar14; lVar49 = lVar49 + 2) {
          *puVar17 = local_470[-1];
          puVar17[1] = *local_470;
          puVar17[2] = local_460[-1];
          puVar17[3] = *local_460;
          puVar17[4] = local_448[-1];
          puVar17[5] = *local_448;
          puVar17[6] = puVar64[-1];
          puVar17[7] = *puVar64;
          puVar17[8] = local_400[-1];
          puVar17[9] = *local_400;
          puVar17[10] = local_450[-1];
          puVar17[0xb] = *local_450;
          puVar17[0xc] = local_430[-1];
          puVar17[0xd] = *local_430;
          puVar17[0xe] = local_438[-1];
          puVar17[0xf] = *local_438;
          puVar17 = puVar17 + 0x10;
          local_438 = local_438 + 2;
          local_430 = local_430 + 2;
          local_450 = local_450 + 2;
          local_400 = local_400 + 2;
          puVar64 = puVar64 + 2;
          local_448 = local_448 + 2;
          local_460 = local_460 + 2;
          local_470 = local_470 + 2;
          local_468 = local_468 + 2;
          local_478 = local_478 + 2;
          local_428 = local_428 + 2;
          local_480 = local_480 + 2;
          local_488 = local_488 + 2;
          local_440 = local_440 + 2;
          local_458 = local_458 + 2;
          local_408 = local_408 + 2;
        }
        puVar42 = puVar42 + 4;
        for (; lVar49 < lVar14; lVar49 = lVar49 + 1) {
          *puVar17 = *local_408;
          puVar17[1] = *local_458;
          puVar17[2] = *local_440;
          puVar17[3] = *local_488;
          puVar17[4] = *local_480;
          puVar17[5] = *local_428;
          puVar17[6] = *local_478;
          puVar17[7] = *local_468;
          puVar17 = puVar17 + 8;
          local_468 = local_468 + 1;
          local_478 = local_478 + 1;
          local_428 = local_428 + 1;
          local_480 = local_480 + 1;
          local_488 = local_488 + 1;
          local_440 = local_440 + 1;
          local_458 = local_458 + 1;
          local_408 = local_408 + 1;
        }
        local_470 = local_3c8;
        local_460 = local_3d0;
        local_448 = local_3d8;
        local_450 = local_340;
        local_430 = local_338;
        local_438 = local_330;
        local_488 = local_328;
        local_458 = local_2f0;
        local_440 = local_2e0;
        local_480 = local_2d0;
        local_478 = local_2c0;
        local_428 = local_238;
        local_468 = local_228;
        puVar20 = local_2c8;
        puVar32 = local_2b8;
        puVar36 = local_220;
        puVar39 = local_2d8;
        puVar43 = local_230;
        puVar55 = puVar17;
        puVar58 = local_210;
        puVar62 = local_200;
        local_408 = local_3c0;
        puVar64 = local_2e8;
        puVar59 = local_218;
        local_400 = local_208;
        for (lVar49 = 0; puVar68 = local_428, lVar49 + 7 < lVar13; lVar49 = lVar49 + 8) {
          *(undefined8 *)(puVar17 + lVar49 * 8) = *(undefined8 *)(local_3c0 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 8) = *(undefined8 *)(local_340 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 0x10) = *(undefined8 *)(local_3c8 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 0x18) = *(undefined8 *)(local_338 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 0x20) = *(undefined8 *)(local_3d0 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 0x28) = *(undefined8 *)(local_330 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 0x30) = *(undefined8 *)(local_3d8 + lVar49);
          *(undefined8 *)(puVar17 + lVar49 * 8 + 0x38) = *(undefined8 *)(local_328 + lVar49);
          puVar55 = puVar55 + 0x40;
          puVar62 = puVar62 + 8;
          puVar58 = puVar58 + 8;
          puVar32 = puVar32 + 8;
          puVar20 = puVar20 + 8;
          puVar36 = puVar36 + 8;
          puVar43 = puVar43 + 8;
          puVar39 = puVar39 + 8;
          puVar64 = puVar64 + 8;
          local_400 = local_400 + 8;
          puVar59 = puVar59 + 8;
          local_468 = local_468 + 8;
          local_428 = local_428 + 8;
          local_478 = local_478 + 8;
          local_480 = local_480 + 8;
          local_440 = local_440 + 8;
          local_458 = local_458 + 8;
          local_488 = local_488 + 8;
          local_438 = local_438 + 8;
          local_430 = local_430 + 8;
          local_450 = local_450 + 8;
          local_448 = local_448 + 8;
          local_460 = local_460 + 8;
          local_470 = local_470 + 8;
          local_408 = local_408 + 8;
        }
        for (; local_428 = puVar59, lVar49 + 3 < lVar13; lVar49 = lVar49 + 4) {
          *puVar55 = puVar64[-3];
          puVar55[1] = puVar64[-2];
          puVar55[2] = puVar64[-1];
          puVar55[3] = *puVar64;
          puVar55[4] = puVar39[-3];
          puVar55[5] = puVar39[-2];
          puVar55[6] = puVar39[-1];
          puVar55[7] = *puVar39;
          puVar55[8] = puVar43[-3];
          puVar55[9] = puVar43[-2];
          puVar55[10] = puVar43[-1];
          puVar55[0xb] = *puVar43;
          puVar55[0xc] = puVar36[-3];
          puVar55[0xd] = puVar36[-2];
          puVar55[0xe] = puVar36[-1];
          puVar55[0xf] = *puVar36;
          puVar55[0x10] = puVar20[-3];
          puVar55[0x11] = puVar20[-2];
          puVar55[0x12] = puVar20[-1];
          puVar55[0x13] = *puVar20;
          puVar55[0x14] = puVar32[-3];
          puVar55[0x15] = puVar32[-2];
          puVar55[0x16] = puVar32[-1];
          puVar55[0x17] = *puVar32;
          puVar55[0x18] = puVar58[-3];
          puVar55[0x19] = puVar58[-2];
          puVar55[0x1a] = puVar58[-1];
          puVar55[0x1b] = *puVar58;
          puVar55[0x1c] = puVar62[-3];
          puVar55[0x1d] = puVar62[-2];
          puVar55[0x1e] = puVar62[-1];
          puVar55[0x1f] = *puVar62;
          puVar55 = puVar55 + 0x20;
          puVar62 = puVar62 + 4;
          puVar58 = puVar58 + 4;
          puVar32 = puVar32 + 4;
          puVar20 = puVar20 + 4;
          puVar36 = puVar36 + 4;
          puVar43 = puVar43 + 4;
          puVar39 = puVar39 + 4;
          puVar64 = puVar64 + 4;
          local_400 = local_400 + 4;
          puVar59 = puVar59 + 4;
          local_468 = local_468 + 4;
          local_478 = local_478 + 4;
          local_480 = local_480 + 4;
          local_440 = local_440 + 4;
          local_458 = local_458 + 4;
          local_488 = local_488 + 4;
          local_438 = local_438 + 4;
          local_430 = local_430 + 4;
          local_450 = local_450 + 4;
          local_448 = local_448 + 4;
          local_460 = local_460 + 4;
          local_470 = local_470 + 4;
          local_408 = local_408 + 4;
          puVar68 = puVar68 + 4;
        }
        for (; lVar49 + 1 < lVar13; lVar49 = lVar49 + 2) {
          *puVar55 = local_458[-1];
          puVar55[1] = *local_458;
          puVar55[2] = local_440[-1];
          puVar55[3] = *local_440;
          puVar55[4] = local_480[-1];
          puVar55[5] = *local_480;
          puVar55[6] = local_478[-1];
          puVar55[7] = *local_478;
          puVar55[8] = puVar68[-1];
          puVar55[9] = *puVar68;
          puVar55[10] = local_468[-1];
          puVar55[0xb] = *local_468;
          puVar55[0xc] = local_428[-1];
          puVar55[0xd] = *local_428;
          puVar55[0xe] = local_400[-1];
          puVar55[0xf] = *local_400;
          puVar55 = puVar55 + 0x10;
          local_400 = local_400 + 2;
          local_468 = local_468 + 2;
          puVar68 = puVar68 + 2;
          local_478 = local_478 + 2;
          local_480 = local_480 + 2;
          local_440 = local_440 + 2;
          local_458 = local_458 + 2;
          local_488 = local_488 + 2;
          local_438 = local_438 + 2;
          local_430 = local_430 + 2;
          local_450 = local_450 + 2;
          local_448 = local_448 + 2;
          local_460 = local_460 + 2;
          local_470 = local_470 + 2;
          local_408 = local_408 + 2;
          local_428 = local_428 + 2;
        }
        for (lVar52 = 0; lVar49 + lVar52 < lVar13; lVar52 = lVar52 + 1) {
          puVar55[lVar52 * 8] = *local_408;
          puVar55[lVar52 * 8 + 1] = *local_470;
          puVar55[lVar52 * 8 + 2] = *local_460;
          puVar55[lVar52 * 8 + 3] = *local_448;
          puVar55[lVar52 * 8 + 4] = *local_450;
          puVar55[lVar52 * 8 + 5] = *local_430;
          puVar55[lVar52 * 8 + 6] = *local_438;
          puVar55[lVar52 * 8 + 7] = *local_488;
          local_488 = local_488 + 1;
          local_438 = local_438 + 1;
          local_430 = local_430 + 1;
          local_450 = local_450 + 1;
          local_448 = local_448 + 1;
          local_460 = local_460 + 1;
          local_470 = local_470 + 1;
          local_408 = local_408 + 1;
        }
        *(float *)((long)pvVar9 + lVar50 + lVar56) =
             1.0 / *(float *)((long)pvVar7 + uVar61 * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 4) =
             1.0 / *(float *)((long)pvVar7 + lVar46 * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 8) =
             1.0 / *(float *)((long)pvVar7 + (uVar61 + lVar27) * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0xc) =
             1.0 / *(float *)((long)pvVar7 + lVar48 * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x10) =
             1.0 / *(float *)((long)pvVar7 + uVar18 * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x14) =
             1.0 / *(float *)((long)pvVar7 + lVar46 * 4 + lVar34 + 4);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x18) =
             1.0 / *(float *)((long)pvVar7 + lVar47 * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x1c) =
             1.0 / *(float *)((long)pvVar7 + lVar48 * 4 + lVar34 + 4);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x20) =
             1.0 / *(float *)((long)pvVar8 + uVar61 * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x24) =
             1.0 / *(float *)((long)pvVar8 + lVar46 * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x28) =
             1.0 / *(float *)((long)pvVar8 + (uVar61 + lVar27) * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x2c) =
             1.0 / *(float *)((long)pvVar8 + lVar48 * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x30) =
             1.0 / *(float *)((long)pvVar8 + uVar18 * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x34) =
             1.0 / *(float *)((long)pvVar8 + lVar46 * 4 + lVar37 + 4);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x38) =
             1.0 / *(float *)((long)pvVar8 + lVar47 * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar50 + lVar56 + 0x3c) =
             1.0 / *(float *)((long)pvVar8 + lVar48 * 4 + lVar37 + 4);
        puVar35 = puVar35 + lVar16;
        local_3f8 = local_3f8 + lVar16;
        local_310 = local_310 + lVar16;
        local_3f0 = local_3f0 + lVar16;
        local_318 = local_318 + lVar16;
        local_3e8 = local_3e8 + lVar16;
        local_320 = local_320 + lVar16;
        local_3e0 = local_3e0 + lVar16;
        uVar26 = (ulong)((int)uVar26 + 2);
        uVar21 = (uint)(byte)((char)uVar21 + 1);
        local_1c0 = local_1c0 + lVar16;
        local_1d0 = local_1d0 + lVar16;
        local_298 = local_298 + lVar16;
        local_3b8 = local_3b8 + lVar16;
        local_1e0 = local_1e0 + lVar16;
        local_1f0 = local_1f0 + lVar16;
        local_2a0 = local_2a0 + lVar16;
        local_2a8 = local_2a8 + lVar16;
        local_1c8 = local_1c8 + lVar16;
        local_1d8 = local_1d8 + lVar16;
        local_1e8 = local_1e8 + lVar16;
        local_1f8 = local_1f8 + lVar16;
        puVar31 = puVar31 + lVar16;
        puVar38 = puVar38 + lVar16;
        puVar67 = puVar67 + lVar16;
        local_2b0 = local_2b0 + lVar16;
        local_328 = local_328 + lVar25;
        local_3d8 = local_3d8 + lVar25;
        local_330 = local_330 + lVar25;
        local_3d0 = local_3d0 + lVar25;
        local_338 = local_338 + lVar25;
        local_3c8 = local_3c8 + lVar25;
        local_340 = local_340 + lVar25;
        local_3c0 = local_3c0 + lVar25;
        local_200 = local_200 + lVar25;
        local_210 = local_210 + lVar25;
        local_2b8 = local_2b8 + lVar25;
        local_2c8 = local_2c8 + lVar25;
        local_220 = local_220 + lVar25;
        local_230 = local_230 + lVar25;
        local_2d8 = local_2d8 + lVar25;
        local_2e8 = local_2e8 + lVar25;
        local_208 = local_208 + lVar25;
        local_218 = local_218 + lVar25;
        local_228 = local_228 + lVar25;
        local_238 = local_238 + lVar25;
        local_2c0 = local_2c0 + lVar25;
        local_2d0 = local_2d0 + lVar25;
        local_2e0 = local_2e0 + lVar25;
        local_2f0 = local_2f0 + lVar25;
      }
      while( true ) {
        uVar21 = (uint)uVar26;
        if (lVar22 <= (long)uVar61) break;
        lVar16 = ((ulong)((uVar21 & 1) + (int)(uVar26 >> 2) + (uint)((uVar21 >> 1 & 1) != 0)) *
                  lVar44 + lVar40) * sVar3;
        *(undefined4 *)puVar42 = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar24);
        *(undefined4 *)((long)puVar42 + 4) = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar29);
        *(undefined4 *)(puVar42 + 1) = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar30);
        *(undefined4 *)((long)puVar42 + 0xc) = *(undefined4 *)((long)pvVar6 + uVar61 * 4 + lVar33);
        uVar26 = (ulong)(((uint)uVar61 & 1) + ((uint)(uVar61 >> 2) & 0x3fffffff) +
                        (uint)(((uint)uVar61 >> 1 & 1) != 0));
        puVar59 = (undefined1 *)((long)pvVar10 + lVar45 * uVar26 + lVar41);
        local_488 = local_3e0;
        puVar35 = puVar31;
        puVar20 = local_2a8;
        puVar32 = local_2a0;
        puVar36 = local_3f8;
        puVar39 = puVar38;
        puVar43 = local_3b8;
        puVar55 = local_3e8;
        puVar58 = local_3f0;
        puVar62 = local_298;
        puVar64 = puVar67;
        puVar17 = local_2b0;
        for (lVar25 = 0; lVar25 + 7 < lVar14; lVar25 = lVar25 + 8) {
          *(undefined8 *)((long)pvVar10 + lVar25 * 4 + lVar16) = *(undefined8 *)(local_3e0 + lVar25)
          ;
          *(undefined8 *)((long)pvVar10 + lVar25 * 4 + lVar16 + 8) =
               *(undefined8 *)(local_3e8 + lVar25);
          *(undefined8 *)((long)pvVar10 + lVar25 * 4 + lVar16 + 0x10) =
               *(undefined8 *)(local_3f0 + lVar25);
          *(undefined8 *)((long)pvVar10 + lVar25 * 4 + lVar16 + 0x18) =
               *(undefined8 *)(local_3f8 + lVar25);
          puVar59 = puVar59 + 0x20;
          puVar62 = puVar62 + 8;
          puVar43 = puVar43 + 8;
          puVar32 = puVar32 + 8;
          puVar20 = puVar20 + 8;
          puVar35 = puVar35 + 8;
          puVar39 = puVar39 + 8;
          puVar64 = puVar64 + 8;
          puVar17 = puVar17 + 8;
          puVar36 = puVar36 + 8;
          puVar58 = puVar58 + 8;
          puVar55 = puVar55 + 8;
          local_488 = local_488 + 8;
        }
        lVar16 = uVar26 * lVar28;
        for (; lVar25 + 3 < lVar14; lVar25 = lVar25 + 4) {
          *puVar59 = puVar20[-3];
          puVar59[1] = puVar20[-2];
          puVar59[2] = puVar20[-1];
          puVar59[3] = *puVar20;
          puVar59[4] = puVar32[-3];
          puVar59[5] = puVar32[-2];
          puVar59[6] = puVar32[-1];
          puVar59[7] = *puVar32;
          puVar59[8] = puVar43[-3];
          puVar59[9] = puVar43[-2];
          puVar59[10] = puVar43[-1];
          puVar59[0xb] = *puVar43;
          puVar59[0xc] = puVar62[-3];
          puVar59[0xd] = puVar62[-2];
          puVar59[0xe] = puVar62[-1];
          puVar59[0xf] = *puVar62;
          puVar59 = puVar59 + 0x10;
          puVar62 = puVar62 + 4;
          puVar43 = puVar43 + 4;
          puVar32 = puVar32 + 4;
          puVar20 = puVar20 + 4;
          puVar35 = puVar35 + 4;
          puVar39 = puVar39 + 4;
          puVar64 = puVar64 + 4;
          puVar17 = puVar17 + 4;
          puVar36 = puVar36 + 4;
          puVar58 = puVar58 + 4;
          puVar55 = puVar55 + 4;
          local_488 = local_488 + 4;
        }
        for (; lVar25 + 1 < lVar14; lVar25 = lVar25 + 2) {
          *puVar59 = puVar17[-1];
          puVar59[1] = *puVar17;
          puVar59[2] = puVar64[-1];
          puVar59[3] = *puVar64;
          puVar59[4] = puVar39[-1];
          puVar59[5] = *puVar39;
          puVar59[6] = puVar35[-1];
          puVar59[7] = *puVar35;
          puVar59 = puVar59 + 8;
          puVar35 = puVar35 + 2;
          puVar39 = puVar39 + 2;
          puVar64 = puVar64 + 2;
          puVar17 = puVar17 + 2;
          puVar36 = puVar36 + 2;
          puVar58 = puVar58 + 2;
          puVar55 = puVar55 + 2;
          local_488 = local_488 + 2;
        }
        for (; lVar25 < lVar14; lVar25 = lVar25 + 1) {
          *puVar59 = *local_488;
          puVar59[1] = *puVar55;
          puVar59[2] = *puVar58;
          puVar59[3] = *puVar36;
          puVar59 = puVar59 + 4;
          puVar36 = puVar36 + 1;
          puVar58 = puVar58 + 1;
          puVar55 = puVar55 + 1;
          local_488 = local_488 + 1;
        }
        local_488 = local_3c0;
        puVar35 = local_2d0;
        puVar20 = local_2c0;
        puVar32 = local_2e8;
        puVar36 = local_3d8;
        puVar39 = local_2e0;
        puVar43 = local_2d8;
        puVar55 = local_3c8;
        puVar58 = local_3d0;
        puVar62 = local_2c8;
        puVar64 = local_2b8;
        puVar17 = local_2f0;
        puVar68 = puVar59;
        for (lVar25 = 0; lVar25 + 7 < lVar13; lVar25 = lVar25 + 8) {
          *(undefined8 *)(puVar59 + lVar25 * 4) = *(undefined8 *)(local_3c0 + lVar25);
          *(undefined8 *)(puVar59 + lVar25 * 4 + 8) = *(undefined8 *)(local_3c8 + lVar25);
          *(undefined8 *)(puVar59 + lVar25 * 4 + 0x10) = *(undefined8 *)(local_3d0 + lVar25);
          *(undefined8 *)(puVar59 + lVar25 * 4 + 0x18) = *(undefined8 *)(local_3d8 + lVar25);
          puVar68 = puVar68 + 0x20;
          puVar64 = puVar64 + 8;
          puVar62 = puVar62 + 8;
          puVar43 = puVar43 + 8;
          puVar32 = puVar32 + 8;
          puVar20 = puVar20 + 8;
          puVar35 = puVar35 + 8;
          puVar39 = puVar39 + 8;
          puVar17 = puVar17 + 8;
          puVar36 = puVar36 + 8;
          puVar58 = puVar58 + 8;
          puVar55 = puVar55 + 8;
          local_488 = local_488 + 8;
        }
        for (; lVar25 + 3 < lVar13; lVar25 = lVar25 + 4) {
          *puVar68 = puVar32[-3];
          puVar68[1] = puVar32[-2];
          puVar68[2] = puVar32[-1];
          puVar68[3] = *puVar32;
          puVar68[4] = puVar43[-3];
          puVar68[5] = puVar43[-2];
          puVar68[6] = puVar43[-1];
          puVar68[7] = *puVar43;
          puVar68[8] = puVar62[-3];
          puVar68[9] = puVar62[-2];
          puVar68[10] = puVar62[-1];
          puVar68[0xb] = *puVar62;
          puVar68[0xc] = puVar64[-3];
          puVar68[0xd] = puVar64[-2];
          puVar68[0xe] = puVar64[-1];
          puVar68[0xf] = *puVar64;
          puVar68 = puVar68 + 0x10;
          puVar64 = puVar64 + 4;
          puVar62 = puVar62 + 4;
          puVar43 = puVar43 + 4;
          puVar32 = puVar32 + 4;
          puVar20 = puVar20 + 4;
          puVar35 = puVar35 + 4;
          puVar39 = puVar39 + 4;
          puVar17 = puVar17 + 4;
          puVar36 = puVar36 + 4;
          puVar58 = puVar58 + 4;
          puVar55 = puVar55 + 4;
          local_488 = local_488 + 4;
        }
        for (; lVar25 + 1 < lVar13; lVar25 = lVar25 + 2) {
          *puVar68 = puVar17[-1];
          puVar68[1] = *puVar17;
          puVar68[2] = puVar39[-1];
          puVar68[3] = *puVar39;
          puVar68[4] = puVar35[-1];
          puVar68[5] = *puVar35;
          puVar68[6] = puVar20[-1];
          puVar68[7] = *puVar20;
          puVar68 = puVar68 + 8;
          puVar20 = puVar20 + 2;
          puVar35 = puVar35 + 2;
          puVar39 = puVar39 + 2;
          puVar17 = puVar17 + 2;
          puVar36 = puVar36 + 2;
          puVar58 = puVar58 + 2;
          puVar55 = puVar55 + 2;
          local_488 = local_488 + 2;
        }
        for (lVar46 = 0; lVar25 + lVar46 < lVar13; lVar46 = lVar46 + 1) {
          puVar68[lVar46 * 4] = *local_488;
          puVar68[lVar46 * 4 + 1] = *puVar55;
          puVar68[lVar46 * 4 + 2] = *puVar58;
          puVar68[lVar46 * 4 + 3] = *puVar36;
          puVar36 = puVar36 + 1;
          puVar58 = puVar58 + 1;
          puVar55 = puVar55 + 1;
          local_488 = local_488 + 1;
        }
        *(float *)((long)pvVar9 + lVar16 + lVar56) =
             1.0 / *(float *)((long)pvVar7 + uVar61 * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 4) =
             1.0 / *(float *)((long)pvVar7 + (uVar61 + lVar22) * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 8) =
             1.0 / *(float *)((long)pvVar7 + (lVar27 + uVar61) * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 0xc) =
             1.0 / *(float *)((long)pvVar7 + (lVar23 + uVar61) * 4 + lVar34);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 0x10) =
             1.0 / *(float *)((long)pvVar8 + uVar61 * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 0x14) =
             1.0 / *(float *)((long)pvVar8 + (uVar61 + lVar22) * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 0x18) =
             1.0 / *(float *)((long)pvVar8 + (lVar27 + uVar61) * 4 + lVar37);
        *(float *)((long)pvVar9 + lVar16 + lVar56 + 0x1c) =
             1.0 / *(float *)((long)pvVar8 + (lVar23 + uVar61) * 4 + lVar37);
        puVar42 = puVar42 + 2;
        uVar61 = uVar61 + 1;
        local_3f8 = local_3f8 + lVar15;
        local_3f0 = local_3f0 + lVar15;
        local_3e8 = local_3e8 + lVar15;
        local_3e0 = local_3e0 + lVar15;
        uVar26 = (ulong)(uVar21 + 1);
        local_298 = local_298 + lVar15;
        local_3b8 = local_3b8 + lVar15;
        local_2a0 = local_2a0 + lVar15;
        local_2a8 = local_2a8 + lVar15;
        puVar31 = puVar31 + lVar15;
        puVar38 = puVar38 + lVar15;
        puVar67 = puVar67 + lVar15;
        local_2b0 = local_2b0 + lVar15;
        local_3d8 = local_3d8 + lVar51;
        local_3d0 = local_3d0 + lVar51;
        local_3c8 = local_3c8 + lVar51;
        local_3c0 = local_3c0 + lVar51;
        local_2b8 = local_2b8 + lVar51;
        local_2c8 = local_2c8 + lVar51;
        local_2d8 = local_2d8 + lVar51;
        local_2e8 = local_2e8 + lVar51;
        local_2c0 = local_2c0 + lVar51;
        local_2d0 = local_2d0 + lVar51;
        local_2e0 = local_2e0 + lVar51;
        local_2f0 = local_2f0 + lVar51;
      }
    }
  }
  else {
    lstm_transform_weight_int8_avx512vnni
              (weight_xc,weight_xc_int8_scales,weight_hc,weight_hc_int8_scales,bias_c,
               &this->weight_data_tm,&this->weight_data_tm_int8_descales,&this->bias_c_data_packed,
               size,num_output,_c,_w,opt);
  }
  if (opt->lightmode == true) {
    piVar1 = (this->super_LSTM).weight_xc_data.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->super_LSTM).weight_xc_data.allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_xc_data.data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
    weight_xc->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data.c = 0;
    (this->super_LSTM).weight_xc_data.dims = 0;
    (this->super_LSTM).weight_xc_data.w = 0;
    (this->super_LSTM).weight_xc_data.h = 0;
    (this->super_LSTM).weight_xc_data.d = 0;
    piVar1 = (this->super_LSTM).bias_c_data.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->super_LSTM).bias_c_data.allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->super_LSTM).bias_c_data.data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).bias_c_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
    bias_c->data = (void *)0x0;
    (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
    (this->super_LSTM).bias_c_data.c = 0;
    (this->super_LSTM).bias_c_data.dims = 0;
    (this->super_LSTM).bias_c_data.w = 0;
    (this->super_LSTM).bias_c_data.h = 0;
    (this->super_LSTM).bias_c_data.d = 0;
    piVar1 = (this->super_LSTM).weight_hc_data.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->super_LSTM).weight_hc_data.allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_hc_data.data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
    weight_hc->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data.c = 0;
    (this->super_LSTM).weight_hc_data.dims = 0;
    (this->super_LSTM).weight_hc_data.w = 0;
    (this->super_LSTM).weight_hc_data.h = 0;
    (this->super_LSTM).weight_hc_data.d = 0;
    piVar1 = (this->super_LSTM).weight_xc_data_int8_scales.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->super_LSTM).weight_xc_data_int8_scales.allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_xc_data_int8_scales.data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.elemsize + 4) = 0;
    weight_xc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.c = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.d = 0;
    piVar1 = (this->super_LSTM).weight_hc_data_int8_scales.refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->super_LSTM).weight_hc_data_int8_scales.allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->super_LSTM).weight_hc_data_int8_scales.data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.elemsize + 4) = 0;
    weight_hc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.c = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx512::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}